

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_info.cpp
# Opt level: O2

sha256_hash * __thiscall
libtorrent::v1_2::peer_info::i2p_destination(sha256_hash *__return_storage_ptr__,peer_info *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  digest32<256L>::clear(__return_storage_ptr__);
  if (((this->flags).m_val & 0x10000) != 0) {
    uVar1 = *(undefined8 *)&(this->ip).impl_.data_;
    uVar2 = *(undefined8 *)((long)&(this->ip).impl_.data_ + 8);
    uVar3 = *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x18);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 4) =
         *(undefined8 *)((long)&(this->ip).impl_.data_ + 0x10);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 6) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->m_number)._M_elems = uVar1;
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 2) = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

sha256_hash peer_info::i2p_destination() const
	{
		sha256_hash ret;
		if (!(flags & i2p_socket)) return ret;

		char const* destination = reinterpret_cast<char const*>(&ip);
		static_assert(sizeof(tcp::endpoint) * 2 >= sizeof(sha256_hash), "tcp::endpoint is smaller than expected");

		std::memcpy(ret.data(), destination, ret.size());
		return ret;
	}